

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

schar print_dungeon(boolean bymenu,schar *rlev,xchar *rdgn)

{
  nh_menuitem *pnVar1;
  char cVar2;
  char cVar3;
  boolean bVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  nh_menuitem_role nVar9;
  int iVar10;
  bool bVar11;
  dungeon *pdVar12;
  trap *ptVar13;
  s_level **ppsVar14;
  branch **ppbVar15;
  menulist menu;
  int selected [1];
  char buf [256];
  lchoice local_638;
  
  init_menulist(&menu);
  if (bymenu != '\0') {
    local_638.idx = 0;
    local_638.menuletter = 'a';
  }
  pdVar12 = dungeons;
  for (iVar8 = 0; iVar8 < n_dgns; iVar8 = iVar8 + 1) {
    cVar3 = pdVar12->num_dunlevs;
    if (cVar3 < 2) {
      sprintf(buf,"%s: level %d",pdVar12,(ulong)(uint)pdVar12->depth_start);
    }
    else {
      sprintf(buf,"%s: levels %d to %d",pdVar12,(ulong)(uint)pdVar12->depth_start,
              (ulong)(((int)cVar3 + pdVar12->depth_start) - 1));
    }
    if (pdVar12->entry_lev != '\x01') {
      if (pdVar12->entry_lev == cVar3) {
        sVar5 = strlen(buf);
        builtin_strncpy(buf + sVar5,", entrance from below",0x16);
      }
      else {
        pcVar6 = eos(buf);
        sprintf(pcVar6,", entrance on %d",
                (ulong)(((int)pdVar12->entry_lev + pdVar12->depth_start) - 1));
      }
    }
    lVar7 = (long)menu.size;
    if (bymenu == '\0') {
      nVar9 = MI_TEXT;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
      }
    }
    else {
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
      }
      nVar9 = MI_HEADING;
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = nVar9;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,buf);
    menu.icount = menu.icount + 1;
    iVar10 = 0;
    ppsVar14 = &sp_levchn;
    while (ppsVar14 = &((s_level *)ppsVar14)->next->next, (s_level *)ppsVar14 != (s_level *)0x0) {
      if (iVar8 == (((s_level *)ppsVar14)->dlevel).dnum) {
        print_branch(&menu,iVar8,iVar10,(int)(((s_level *)ppsVar14)->dlevel).dlevel,bymenu,
                     &local_638);
        sprintf(buf,"   %s: %d",((s_level *)ppsVar14)->proto,
                (ulong)(uint)(int)(char)((char)dungeons[(((s_level *)ppsVar14)->dlevel).dnum].
                                               depth_start + (((s_level *)ppsVar14)->dlevel).dlevel
                                        + -1));
        if (((((s_level *)ppsVar14)->dlevel).dnum == dungeon_topology.d_stronghold_level.dnum) &&
           ((((s_level *)ppsVar14)->dlevel).dlevel == dungeon_topology.d_stronghold_level.dlevel)) {
          pcVar6 = eos(buf);
          sprintf(pcVar6," (tune %s)",tune);
        }
        if (bymenu == '\0') {
          lVar7 = (long)menu.size;
          if (menu.size <= menu.icount) {
            menu.size = menu.size * 2;
            menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
          }
          pnVar1 = menu.items + menu.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,buf);
        }
        else {
          if ((iVar8 == dungeon_topology.d_advcal_level.dnum) ||
             (iVar8 == dungeon_topology.d_knox_level.dnum)) {
            cVar3 = (char)dungeons[(((s_level *)ppsVar14)->dlevel).dnum].depth_start +
                    (((s_level *)ppsVar14)->dlevel).dlevel + -1;
            local_638.lev[local_638.idx] = cVar3;
            local_638.dgn[local_638.idx] = '\0';
          }
          else {
            cVar3 = (((s_level *)ppsVar14)->dlevel).dlevel;
            local_638.lev[local_638.idx] = cVar3;
            local_638.dgn[local_638.idx] = (xchar)iVar8;
            cVar3 = cVar3 + (char)dungeons[(((s_level *)ppsVar14)->dlevel).dnum].depth_start + -1;
          }
          local_638.playerlev[local_638.idx] = cVar3;
          lVar7 = (long)menu.size;
          if (menu.size <= menu.icount) {
            menu.size = menu.size * 2;
            menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
          }
          cVar3 = local_638.menuletter;
          iVar10 = local_638.idx + 1;
          pnVar1 = menu.items + menu.icount;
          pnVar1->id = iVar10;
          pnVar1->role = MI_NORMAL;
          pnVar1->accel = local_638.menuletter;
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,buf);
          local_638.idx = iVar10;
          if (cVar3 == 'z') {
            local_638.menuletter = 'A';
          }
          else if (cVar3 == 'Z') {
            local_638.menuletter = 'a';
          }
          else {
            local_638.menuletter = cVar3 + '\x01';
          }
        }
        menu.icount = menu.icount + 1;
        iVar10 = (int)(((s_level *)ppsVar14)->dlevel).dlevel;
      }
    }
    print_branch(&menu,iVar8,iVar10,0x20,bymenu,&local_638);
    pdVar12 = pdVar12 + 1;
  }
  ppbVar15 = &branches;
  bVar11 = false;
LAB_00188ac6:
  do {
    ppbVar15 = &((branch *)ppbVar15)->next->next;
    if ((branch *)ppbVar15 == (branch *)0x0) break;
    if (n_dgns == (((branch *)ppbVar15)->end1).dnum) {
      if (!bVar11) {
        if (bymenu != '\0') {
          pcVar6 = br_string(((branch *)ppbVar15)->type);
          sprintf(buf,"   %s to %s",pcVar6);
          bVar11 = true;
          goto LAB_00188ac6;
        }
        lVar7 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
        }
        lVar7 = (long)menu.icount;
        menu.items[lVar7].accel = '\0';
        menu.items[lVar7].group_accel = '\0';
        menu.items[lVar7].selected = '\0';
        menu.items[lVar7].id = 0;
        menu.items[lVar7].role = MI_TEXT;
        menu.items[lVar7].caption[0] = '\0';
        menu.icount = menu.icount + 1;
        lVar7 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
        }
        menu.items[menu.icount].id = 0;
        menu.items[menu.icount].role = MI_TEXT;
        menu.items[menu.icount].accel = '\0';
        menu.items[menu.icount].group_accel = '\0';
        menu.items[menu.icount].selected = '\0';
        builtin_strncpy(menu.items[menu.icount].caption,"Floating branche",0x10);
        menu.items[menu.icount].caption[0x10] = 's';
        menu.items[menu.icount].caption[0x11] = '\0';
        menu.icount = menu.icount + 1;
      }
      pcVar6 = br_string(((branch *)ppbVar15)->type);
      sprintf(buf,"   %s to %s",pcVar6);
      bVar11 = true;
      if (bymenu == '\0') {
        lVar7 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
        }
        pnVar1 = menu.items + menu.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,buf);
        menu.icount = menu.icount + 1;
      }
    }
  } while( true );
  if (bymenu != '\0') {
    iVar8 = display_menu(menu.items,menu.icount,"Level teleport to where:",1,selected);
    free(menu.items);
    if ((0 < iVar8) && (rdgn != (xchar *)0x0 && rlev != (schar *)0x0)) {
      lVar7 = (long)selected[0];
      *rlev = local_638.lev[lVar7 + -1];
      *rdgn = local_638.dgn[lVar7 + -1];
      return local_638.playerlev[lVar7 + -1];
    }
    return '\0';
  }
  bVar4 = Invocation_lev(&u.uz);
  if (bVar4 == '\0') {
    if (((((u.uz.dnum != dungeon_topology.d_earth_level.dnum) ||
          (u.uz.dlevel != dungeon_topology.d_earth_level.dlevel)) &&
         ((u.uz.dnum != dungeon_topology.d_water_level.dnum ||
          (u.uz.dlevel != dungeon_topology.d_water_level.dlevel)))) &&
        ((u.uz.dnum != dungeon_topology.d_fire_level.dnum ||
         (u.uz.dlevel != dungeon_topology.d_fire_level.dlevel)))) &&
       ((u.uz.dnum != dungeon_topology.d_air_level.dnum ||
        (u.uz.dlevel != dungeon_topology.d_air_level.dlevel)))) goto LAB_00188ece;
    ptVar13 = (trap *)&level->lev_traps;
    do {
      ptVar13 = ptVar13->ntrap;
      if (ptVar13 == (trap *)0x0) break;
    } while ((ptVar13->field_0x8 & 0x1f) != 0x12);
    lVar7 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
    }
    lVar7 = (long)menu.icount;
    menu.items[lVar7].accel = '\0';
    menu.items[lVar7].group_accel = '\0';
    menu.items[lVar7].selected = '\0';
    menu.items[lVar7].caption[0] = '\0';
    menu.items[lVar7].id = 0;
    menu.items[lVar7].role = MI_TEXT;
    menu.icount = menu.icount + 1;
    if (ptVar13 != (trap *)0x0) {
      cVar3 = ptVar13->tx;
      cVar2 = ptVar13->ty;
      pcVar6 = "Portal @ (%d,%d), hero @ (%d,%d)";
      goto LAB_00188e5f;
    }
    buf[0] = 'N';
    buf[1] = 'o';
    buf[2] = ' ';
    buf[3] = 'p';
    buf[4] = 'o';
    buf[5] = 'r';
    buf[6] = 't';
    buf[7] = 'a';
    buf[8] = 'l';
    buf[9] = ' ';
    buf[10] = 'f';
    buf[0xb] = 'o';
    buf[0xc] = 'u';
    buf[0xd] = 'n';
    buf[0xe] = 'd';
    buf[0xf] = '.';
    buf[0x10] = '\0';
  }
  else {
    lVar7 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
    }
    lVar7 = (long)menu.icount;
    menu.items[lVar7].accel = '\0';
    menu.items[lVar7].group_accel = '\0';
    menu.items[lVar7].selected = '\0';
    menu.items[lVar7].caption[0] = '\0';
    menu.items[lVar7].id = 0;
    menu.items[lVar7].role = MI_TEXT;
    menu.icount = menu.icount + 1;
    pcVar6 = "Invocation position @ (%d,%d), hero @ (%d,%d)";
    cVar2 = inv_pos.y;
    cVar3 = inv_pos.x;
LAB_00188e5f:
    sprintf(buf,pcVar6,(ulong)(uint)(int)cVar3,(ulong)(uint)(int)cVar2,(ulong)(uint)(int)u.ux,
            (ulong)(uint)(int)u.uy);
  }
  lVar7 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
  }
  pnVar1 = menu.items + menu.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,buf);
  menu.icount = menu.icount + 1;
LAB_00188ece:
  display_menu(menu.items,menu.icount,"Level teleport to where:",0,(int *)0x0);
  free(menu.items);
  return '\0';
}

Assistant:

schar print_dungeon(boolean bymenu, schar *rlev, xchar *rdgn)
{
    int     i, last_level, nlev;
    char    buf[BUFSZ];
    boolean first;
    s_level *slev;
    dungeon *dptr;
    branch  *br;
    struct lchoice lchoices;
    struct menulist menu;
    
    init_menulist(&menu);

    if (bymenu) {
	lchoices.idx = 0;
	lchoices.menuletter = 'a';
    }

    for (i = 0, dptr = dungeons; i < n_dgns; i++, dptr++) {
	nlev = dptr->num_dunlevs;
	if (nlev > 1)
	    sprintf(buf, "%s: levels %d to %d", dptr->dname, dptr->depth_start,
						dptr->depth_start + nlev - 1);
	else
	    sprintf(buf, "%s: level %d", dptr->dname, dptr->depth_start);

	/* Most entrances are uninteresting. */
	if (dptr->entry_lev != 1) {
	    if (dptr->entry_lev == nlev)
		strcat(buf, ", entrance from below");
	    else
		sprintf(eos(buf), ", entrance on %d",
			dptr->depth_start + dptr->entry_lev - 1);
	}
	if (bymenu) {
	    add_menuheading(&menu, buf);
	} else
	    add_menutext(&menu, buf);

	/*
	 * Circle through the special levels to find levels that are in
	 * this dungeon.
	 */
	for (slev = sp_levchn, last_level = 0; slev; slev = slev->next) {
	    if (slev->dlevel.dnum != i)
		continue;

	    /* print any branches before this level */
	    print_branch(&menu, i, last_level, slev->dlevel.dlevel,
			 bymenu, &lchoices);

	    sprintf(buf, "   %s: %d", slev->proto, depth(&slev->dlevel));
	    if (Is_stronghold(&slev->dlevel))
		sprintf(eos(buf), " (tune %s)", tune);
	    if (bymenu) {
		/* If other floating branches are added, this will need to change */
		if (i != advcal_level.dnum && i != knox_level.dnum) {
			lchoices.lev[lchoices.idx] = slev->dlevel.dlevel;
			lchoices.dgn[lchoices.idx] = i;
		} else {
			lchoices.lev[lchoices.idx] = depth(&slev->dlevel);
			lchoices.dgn[lchoices.idx] = 0;
		}
		lchoices.playerlev[lchoices.idx] = depth(&slev->dlevel);
		
		add_menuitem(&menu, lchoices.idx + 1, buf, lchoices.menuletter, FALSE);
		if (lchoices.menuletter == 'z') lchoices.menuletter = 'A';
		else if (lchoices.menuletter == 'Z') lchoices.menuletter = 'a';
		else lchoices.menuletter++;
		lchoices.idx++;
	    } else
		add_menutext(&menu, buf);

	    last_level = slev->dlevel.dlevel;
	}
	/* print branches after the last special level */
	print_branch(&menu, i, last_level, MAXLEVEL, bymenu, &lchoices);
    }

    /* Print out floating branches (if any). */
    for (first = TRUE, br = branches; br; br = br->next) {
	if (br->end1.dnum == n_dgns) {
	    if (first) {
	    	if (!bymenu) {
		    add_menutext(&menu, "");
		    add_menutext(&menu, "Floating branches");
		}
		first = FALSE;
	    }
	    sprintf(buf, "   %s to %s",
			br_string(br->type), dungeons[br->end2.dnum].dname);
	    if (!bymenu)
		add_menutext(&menu, buf);
	}
    }
    
    if (bymenu) {
    	int n;
	int selected[1];
	int idx;
	
	n = display_menu(menu.items, menu.icount, "Level teleport to where:",
			 PICK_ONE, selected);
	free(menu.items);
	if (n > 0) {
		idx = selected[0] - 1;
		if (rlev && rdgn) {
			*rlev = lchoices.lev[idx];
			*rdgn = lchoices.dgn[idx];
			return lchoices.playerlev[idx];
		}
	}
	return 0;
    }

    /* I hate searching for the invocation pos while debugging. -dean */
    if (Invocation_lev(&u.uz)) {
	add_menutext(&menu, "");
	sprintf(buf, "Invocation position @ (%d,%d), hero @ (%d,%d)",
		inv_pos.x, inv_pos.y, u.ux, u.uy);
	add_menutext(&menu, buf);
    }
    /*
     * The following is based on the assumption that the inter-level portals
     * created by the level compiler (not the dungeon compiler) only exist
     * one per level (currently true, of course).
     */
    else if (Is_earthlevel(&u.uz) || Is_waterlevel(&u.uz)
				|| Is_firelevel(&u.uz) || Is_airlevel(&u.uz)) {
	struct trap *trap;
	for (trap = level->lev_traps; trap; trap = trap->ntrap)
	    if (trap->ttyp == MAGIC_PORTAL)
		break;

	add_menutext(&menu, "");
	if (trap)
	    sprintf(buf, "Portal @ (%d,%d), hero @ (%d,%d)",
		trap->tx, trap->ty, u.ux, u.uy);
	else
	    sprintf(buf, "No portal found.");
	add_menutext(&menu, buf);
    }
    
    display_menu(menu.items, menu.icount, "Level teleport to where:", PICK_NONE, NULL);
    free(menu.items);
    return 0;
}